

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.c
# Opt level: O0

int ecs_fini(ecs_world_t *world)

{
  ecs_world_t *world_local;
  
  _ecs_assert(world->magic == 0x65637377,2,(char *)0x0,"world->magic == ECS_WORLD_MAGIC",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22b);
  if (world->magic != 0x65637377) {
    __assert_fail("world->magic == (0x65637377)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22b,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)((world->in_progress ^ 0xffU) & 1),0x32,(char *)0x0,"!world->in_progress",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22c);
  if ((world->in_progress & 1U) != 0) {
    __assert_fail("!world->in_progress",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22c,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)((world->is_merging ^ 0xffU) & 1),0x32,(char *)0x0,"!world->is_merging",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22d);
  if ((world->is_merging & 1U) != 0) {
    __assert_fail("!world->is_merging",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                  ,0x22d,"int ecs_fini(ecs_world_t *)");
  }
  _ecs_assert((_Bool)((world->is_fini ^ 0xffU) & 1),0x32,(char *)0x0,"!world->is_fini",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
              ,0x22e);
  if ((world->is_fini & 1U) == 0) {
    world->is_fini = true;
    fini_unset_tables(world);
    fini_actions(world);
    if ((world->locking_enabled & 1U) != 0) {
      (*ecs_os_api.mutex_free_)(world->mutex);
    }
    fini_stages(world);
    fini_store(world);
    fini_component_lifecycle(world);
    fini_queries(world);
    fini_child_tables(world);
    fini_aliases(world);
    fini_misc(world);
    world->magic = 0;
    ecs_increase_timer_resolution(false);
    (*ecs_os_api.free_)(world);
    ecs_os_fini();
    return 0;
  }
  __assert_fail("!world->is_fini",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/world.c"
                ,0x22e,"int ecs_fini(ecs_world_t *)");
}

Assistant:

int ecs_fini(
    ecs_world_t *world)
{
    ecs_assert(world->magic == ECS_WORLD_MAGIC, ECS_INVALID_PARAMETER, NULL);
    ecs_assert(!world->in_progress, ECS_INVALID_OPERATION, NULL);
    ecs_assert(!world->is_merging, ECS_INVALID_OPERATION, NULL);
    ecs_assert(!world->is_fini, ECS_INVALID_OPERATION, NULL);

    world->is_fini = true;

    fini_unset_tables(world);

    fini_actions(world);    

    if (world->locking_enabled) {
        ecs_os_mutex_free(world->mutex);
    }

    fini_stages(world);

    fini_store(world);

    fini_component_lifecycle(world);

    fini_queries(world);

    fini_child_tables(world);

    fini_aliases(world);

    fini_misc(world);

    /* In case the application tries to use the memory of the freed world, this
     * will trigger an assert */
    world->magic = 0;

    ecs_increase_timer_resolution(0);

    /* End of the world */
    ecs_os_free(world);

    ecs_os_fini(); 

    return 0;
}